

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O2

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateF32ArrHelper
          (BuiltInsValidator *this,Decoration *decoration,Instruction *inst,uint32_t num_components,
          function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *diag,uint32_t underlying_type)

{
  bool bVar1;
  uint32_t uVar2;
  spv_result_t sVar3;
  Instruction *pIVar4;
  ostream *poVar5;
  undefined4 in_register_0000000c;
  Instruction *inst_00;
  char *pcVar6;
  uint64_t actual_num_components;
  ostringstream ss;
  uint64_t local_1d0;
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [11];
  
  inst_00 = (Instruction *)CONCAT44(in_register_0000000c,num_components);
  pIVar4 = ValidationState_t::FindDef(this->_,underlying_type);
  if ((pIVar4->inst_).opcode == 0x1c) {
    uVar2 = (pIVar4->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start[2];
    bVar1 = ValidationState_t::IsFloatScalarType(this->_,uVar2);
    if (bVar1) {
      uVar2 = ValidationState_t::GetBitWidth(this->_,uVar2);
      if (uVar2 == 0x20) {
        if (num_components == 0) {
          return SPV_SUCCESS;
        }
        local_1d0 = 0;
        bVar1 = ValidationState_t::EvalConstantValUint64
                          (this->_,(pIVar4->words_).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[3],&local_1d0);
        if (!bVar1) {
          __assert_fail("0 && \"Array type definition is corrupt\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp"
                        ,0x468,
                        "spv_result_t spvtools::val::(anonymous namespace)::BuiltInsValidator::ValidateF32ArrHelper(const Decoration &, const Instruction &, uint32_t, const std::function<spv_result_t (const std::string &)> &, uint32_t)"
                       );
        }
        if (local_1d0 == num_components) {
          return SPV_SUCCESS;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
                  (&local_1c8,decoration,(Decoration *)inst,inst_00);
        poVar5 = std::operator<<((ostream *)local_1a8,(string *)&local_1c8);
        poVar5 = std::operator<<(poVar5," has ");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        pcVar6 = " components.";
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
                  (&local_1c8,decoration,(Decoration *)inst,inst_00);
        poVar5 = std::operator<<((ostream *)local_1a8,(string *)&local_1c8);
        poVar5 = std::operator<<(poVar5," has components with bit width ");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        pcVar6 = ".";
      }
      std::operator<<(poVar5,pcVar6);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::stringbuf::str();
      sVar3 = std::
              function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::operator()(diag,&local_1c8);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      return sVar3;
    }
    (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
              (&local_1c8,decoration,(Decoration *)inst,inst_00);
    std::operator+(local_1a8,&local_1c8," components are not float scalar.");
  }
  else {
    (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
              (&local_1c8,decoration,(Decoration *)inst,inst_00);
    std::operator+(local_1a8,&local_1c8," is not an array.");
  }
  sVar3 = std::
          function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::operator()(diag,local_1a8);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return sVar3;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateF32ArrHelper(
    const Decoration& decoration, const Instruction& inst,
    uint32_t num_components,
    const std::function<spv_result_t(const std::string& message)>& diag,
    uint32_t underlying_type) {
  const Instruction* const type_inst = _.FindDef(underlying_type);
  if (type_inst->opcode() != spv::Op::OpTypeArray) {
    return diag(GetDefinitionDesc(decoration, inst) + " is not an array.");
  }

  const uint32_t component_type = type_inst->word(2);
  if (!_.IsFloatScalarType(component_type)) {
    return diag(GetDefinitionDesc(decoration, inst) +
                " components are not float scalar.");
  }

  const uint32_t bit_width = _.GetBitWidth(component_type);
  if (bit_width != 32) {
    std::ostringstream ss;
    ss << GetDefinitionDesc(decoration, inst)
       << " has components with bit width " << bit_width << ".";
    return diag(ss.str());
  }

  if (num_components != 0) {
    uint64_t actual_num_components = 0;
    if (!_.EvalConstantValUint64(type_inst->word(3), &actual_num_components)) {
      assert(0 && "Array type definition is corrupt");
    }
    if (actual_num_components != num_components) {
      std::ostringstream ss;
      ss << GetDefinitionDesc(decoration, inst) << " has "
         << actual_num_components << " components.";
      return diag(ss.str());
    }
  }

  return SPV_SUCCESS;
}